

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

char * __thiscall cmSourceFile::GetProperty(cmSourceFile *this,string *prop)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  cmState *this_01;
  
  bVar1 = std::operator==(prop,"LOCATION");
  if (bVar1) {
    pcVar2 = (char *)(this->FullPath)._M_string_length;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (this->FullPath)._M_dataplus._M_p;
    }
  }
  else {
    pcVar2 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
    if (pcVar2 == (char *)0x0) {
      this_00 = (this->Location).Makefile;
      this_01 = cmMakefile::GetState(this_00);
      bVar1 = cmState::IsPropertyChained(this_01,prop,SOURCE_FILE);
      if (bVar1) {
        pcVar2 = cmMakefile::GetProperty(this_00,prop,true);
        return pcVar2;
      }
      pcVar2 = (char *)0x0;
    }
  }
  return pcVar2;
}

Assistant:

const char* cmSourceFile::GetProperty(const std::string& prop) const
{
  // Check for computed properties.
  if(prop == "LOCATION")
    {
    if(this->FullPath.empty())
      {
      return 0;
      }
    else
      {
      return this->FullPath.c_str();
      }
    }

  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal)
    {
    cmMakefile const* mf = this->Location.GetMakefile();
    const bool chain = mf->GetState()->
                      IsPropertyChained(prop, cmProperty::SOURCE_FILE);
    if (chain)
      {
      return mf->GetProperty(prop, chain);
      }
    }

  return retVal;
}